

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TextWrappedV(char *fmt,__va_list_tag *args)

{
  float *pfVar1;
  ImGuiWindow *pIVar2;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  pfVar1 = &(pIVar2->DC).TextWrapPos;
  if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
    PushTextWrapPos(0.0);
    TextV(fmt,args);
    PopTextWrapPos();
    return;
  }
  TextV(fmt,args);
  return;
}

Assistant:

void ImGui::TextWrappedV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    bool need_backup = (window->DC.TextWrapPos < 0.0f);  // Keep existing wrap position if one is already set
    if (need_backup)
        PushTextWrapPos(0.0f);
    TextV(fmt, args);
    if (need_backup)
        PopTextWrapPos();
}